

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O0

void oafdict_init(ion_dictionary_handler_t *handler)

{
  ion_dictionary_handler_t *handler_local;
  
  handler->insert = oafdict_insert;
  handler->create_dictionary = oafdict_create_dictionary;
  handler->get = oafdict_get;
  handler->update = oafdict_update;
  handler->find = oafdict_find;
  handler->remove = oafdict_delete;
  handler->delete_dictionary = oafdict_delete_dictionary;
  handler->destroy_dictionary = oafdict_destroy_dictionary;
  handler->open_dictionary = oafdict_open_dictionary;
  handler->close_dictionary = oafdict_close_dictionary;
  return;
}

Assistant:

void
oafdict_init(
	ion_dictionary_handler_t *handler
) {
	handler->insert				= oafdict_insert;
	handler->create_dictionary	= oafdict_create_dictionary;
	handler->get				= oafdict_get;
	handler->update				= oafdict_update;
	handler->find				= oafdict_find;
	handler->remove				= oafdict_delete;
	handler->delete_dictionary	= oafdict_delete_dictionary;
	handler->destroy_dictionary = oafdict_destroy_dictionary;
	handler->open_dictionary	= oafdict_open_dictionary;
	handler->close_dictionary	= oafdict_close_dictionary;
}